

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall LiteralsTest_Format_Test::TestBody(LiteralsTest_Format_Test *this)

{
  undefined4 uVar1;
  int *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual;
  char *message;
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> udl_format_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> udl_format;
  
  uVar1._0_1_ = true;
  uVar1._1_3_ = 0;
  udl_format_w._M_dataplus._M_p._0_4_ = uVar1;
  fmt::v5::internal::udl_formatter<char,(char)123,(char)125,(char)99,(char)123,(char)125>::
  operator()(&udl_format,&gtest_ar,(char (*) [3])0x1e4a24,(int *)&udl_format_w);
  gtest_ar_1._0_4_ = uVar1;
  fmt::v5::format<char[6],char[3],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&udl_format_w,
             (v5 *)"{}c{}",(char (*) [6])0x1e4a24,&gtest_ar_1.success_,in_R8);
  actual = &udl_format;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"format(\"{}c{}\", \"ab\", 1)","udl_format",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&udl_format_w,
             actual);
  std::__cxx11::string::~string((string *)&udl_format_w);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&udl_format_w);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x75c,(char *)actual);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&udl_format_w)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&udl_format_w);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  fmt::v5::internal::
  udl_formatter<wchar_t,(wchar_t)123,(wchar_t)125,(wchar_t)99,(wchar_t)123,(wchar_t)125>::operator()
            (&udl_format_w,&gtest_ar_1,(wchar_t (*) [3])L"ab",(int *)&gtest_ar);
  local_78.data_._0_4_ = 1;
  fmt::v5::format<wchar_t[6],wchar_t[3],int>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
             ,(v5 *)L"{}c{}",(wchar_t (*) [6])L"ab",(wchar_t (*) [3])&local_78,(int *)actual);
  testing::internal::CmpHelperEQ<std::__cxx11::wstring,std::__cxx11::wstring>
            ((internal *)&gtest_ar_1,"format(L\"{}c{}\", L\"ab\", 1)","udl_format_w",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&gtest_ar
             ,&udl_format_w);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x75e,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::wstring::~wstring((wstring *)&udl_format_w);
  std::__cxx11::string::~string((string *)&udl_format);
  return;
}

Assistant:

TEST(LiteralsTest, Format) {
  auto udl_format = "{}c{}"_format("ab", 1);
  EXPECT_EQ(format("{}c{}", "ab", 1), udl_format);
  auto udl_format_w = L"{}c{}"_format(L"ab", 1);
  EXPECT_EQ(format(L"{}c{}", L"ab", 1), udl_format_w);
}